

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall gl4cts::GPUShaderFP64Test10::deinit(GPUShaderFP64Test10 *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_transform_feedback_buffer_id != 0) {
    (**(code **)(lVar2 + 0x40))(0x8c8e,0);
    (**(code **)(lVar2 + 0x438))(1,&this->m_transform_feedback_buffer_id);
    this->m_transform_feedback_buffer_id = 0;
  }
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar2 + 0xd8))(0);
    (**(code **)(lVar2 + 0x490))(1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean buffers */
	if (0 != m_transform_feedback_buffer_id)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.deleteBuffers(1, &m_transform_feedback_buffer_id);
		m_transform_feedback_buffer_id = 0;
	}

	/* Clean VAO */
	if (0 != m_vertex_array_object_id)
	{
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
		m_vertex_array_object_id = 0;
	}
}